

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_CHARACTER::OAssign(_Type_CHARACTER *this,Variable *src,Variable *dest)

{
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  String *pSVar4;
  Character *pCVar5;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar6;
  Variable VVar7;
  String local_88;
  String local_68;
  uint local_48;
  undefined1 local_38 [8];
  Variable tmp;
  Variable *dest_local;
  Variable *src_local;
  _Type_CHARACTER *this_local;
  
  tmp.nb_ref = (uint *)in_RCX;
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)_type_string);
  if (bVar1) {
    Variable::Convert((Variable *)local_38,(Type *)tmp.nb_ref);
    pOVar2 = Variable::operator->((Variable *)local_38);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator!=(pTVar3,(Type *)_type_string);
    if (bVar1) {
      Variable::Variable((Variable *)this,dest);
    }
    else {
      pOVar2 = Variable::operator->((Variable *)local_38);
      pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
      pOVar2 = Variable::operator->(dest);
      pCVar5 = Object::GetData<LiteScript::Character>(pOVar2);
      Character::operator=(&local_68,pCVar5,pSVar4);
      String::~String(&local_68);
    }
    local_48 = (uint)bVar1;
    Variable::~Variable((Variable *)local_38);
    puVar6 = extraout_RDX;
    if (local_48 != 0) goto LAB_001458a4;
  }
  else {
    pOVar2 = Variable::operator->((Variable *)tmp.nb_ref);
    pSVar4 = Object::GetData<LiteScript::String>(pOVar2);
    pOVar2 = Variable::operator->(dest);
    pCVar5 = Object::GetData<LiteScript::Character>(pOVar2);
    Character::operator=(&local_88,pCVar5,pSVar4);
    String::~String(&local_88);
  }
  Variable::Variable((Variable *)this,dest);
  puVar6 = extraout_RDX_00;
LAB_001458a4:
  VVar7.nb_ref = puVar6;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OAssign(LiteScript::Variable& src, const LiteScript::Variable& dest) const {
    if (dest->GetType() != Type::STRING) {
        Variable tmp = dest.Convert(Type::STRING);
        if (tmp->GetType() != Type::STRING)
            return Variable(src);
        src->GetData<Character>() = tmp->GetData<String>();
    }
    else {
        src->GetData<Character>() = dest->GetData<String>();
    }
    return Variable(src);
}